

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::trivialHeuristic(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  long lVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  Tolerances *pTVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  Item *pIVar7;
  Nonzero<double> *pNVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pdVar9;
  undefined1 auVar10 [16];
  Real RVar11;
  bool bVar12;
  bool bVar13;
  double *pdVar14;
  VectorBase<double> *pVVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar22;
  double dVar23;
  VectorBase<double> downLocks;
  VectorBase<double> upLocks;
  VectorBase<double> locksol;
  VectorBase<double> uppersol;
  VectorBase<double> lowersol;
  VectorBase<double> zerosol;
  undefined1 local_1c8 [16];
  double local_1a0;
  double local_198;
  double local_190;
  VectorBase<double> local_178;
  VectorBase<double> local_160;
  undefined1 local_148 [16];
  SPxLPBase<double> *local_130;
  vector<double,_std::allocator<double>_> local_128;
  vector<double,_std::allocator<double>_> local_110;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  long local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_e0,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_f8,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_110,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_128,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&local_160,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  VectorBase<double>::VectorBase
            (&local_178,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  dVar2 = (this->super_SPxSimplifier<double>).m_objoffset;
  ::soplex::infinity::__tls_init();
  pdVar14 = (double *)__tls_get_addr(&PTR_003b4b70);
  dVar22 = feastol(this);
  ::soplex::infinity::__tls_init();
  pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  RVar11 = Tolerances::epsilon(pTVar5);
  dVar3 = *pdVar14;
  dVar22 = 1.0 / dVar22 - dVar3;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_1c8._8_4_ = extraout_XMM0_Dc;
    local_1c8._0_8_ = -RVar11;
    local_1c8._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  uVar19 = (undefined4)((ulong)-RVar11 >> 0x20);
  uStack_c0 = 0;
  local_c8 = dVar3;
  if (dVar22 <= (double)CONCAT44(uVar19,SUB84(RVar11,0)) &&
      (double)CONCAT44(uVar19,SUB84(RVar11,0)) != dVar22) {
    local_c8 = feastol(this);
    local_c8 = 1.0 / local_c8;
  }
  uStack_c0 = 0;
  lVar16 = (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_1a0 = dVar2;
  local_198 = dVar2;
  local_190 = dVar2;
  if (lVar16 < 1) {
    bVar13 = true;
  }
  else {
    uStack_44 = local_c8._4_4_ ^ 0x80000000;
    local_48 = (undefined4)local_c8;
    uStack_40 = 0;
    uStack_3c = 0x80000000;
    bVar13 = true;
    local_130 = lp;
    do {
      lVar1 = lVar16 + -1;
      local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar16 + -1] = 0.0;
      local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar16 + -1] = 0.0;
      pIVar7 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar16 + -1].idx;
      local_b0 = lVar16;
      if (0 < pIVar7[iVar4].data.super_SVectorBase<double>.memused) {
        pIVar7 = pIVar7 + iVar4;
        lVar17 = 8;
        lVar16 = 0;
        do {
          pNVar8 = (pIVar7->data).super_SVectorBase<double>.m_elem;
          dVar22 = *(double *)((long)pNVar8 + lVar17 + -8);
          dVar23 = (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[*(int *)((long)&pNVar8->val + lVar17)];
          ::soplex::infinity::__tls_init();
          pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          RVar11 = Tolerances::epsilon(pTVar5);
          if (dVar23 + dVar3 <= RVar11) {
            bVar12 = false;
          }
          else {
            dVar23 = (lp->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [*(int *)((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val +
                              lVar17)];
            ::soplex::infinity::__tls_init();
            pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this_00 = (this->super_SPxSimplifier<double>)._tolerances.
                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            RVar11 = Tolerances::epsilon(pTVar5);
            bVar12 = dVar23 - dVar3 < -RVar11;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          local_1c8._0_8_ = dVar23;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          lp = local_130;
          if (bVar12) {
            local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar1] =
                 local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1] + 1.0;
            pVVar15 = &local_178;
LAB_00216620:
            pdVar9 = (pVVar15->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9[lVar1] = pdVar9[lVar1] + 1.0;
          }
          else {
            local_1c8._0_8_ =
                 (local_130->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[*(int *)((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val +
                                   lVar17)];
            ::soplex::infinity::__tls_init();
            pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              }
            }
            RVar11 = Tolerances::epsilon(pTVar5);
            uVar19 = SUB84(RVar11,0);
            uVar20 = (undefined4)((ulong)RVar11 >> 0x20);
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_148._0_8_ = RVar11;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              uVar19 = local_148._0_4_;
              uVar20 = local_148._4_4_;
            }
            dVar23 = (double)local_1c8._0_8_ + dVar3;
            if ((double)CONCAT44(uVar20,uVar19) <= dVar23 &&
                dVar23 != (double)CONCAT44(uVar20,uVar19)) {
              pVVar15 = &local_178;
              if (dVar22 <= 0.0) {
                pVVar15 = &local_160;
joined_r0x002167cd:
                if (0.0 <= dVar22) goto LAB_00216635;
              }
              goto LAB_00216620;
            }
            local_1c8._0_8_ =
                 (lp->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[*(int *)((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val +
                                   lVar17)];
            ::soplex::infinity::__tls_init();
            pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              }
            }
            RVar11 = Tolerances::epsilon(pTVar5);
            uVar19 = SUB84(RVar11,0);
            uVar20 = (int)((ulong)RVar11 >> 0x20);
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_148._8_4_ = extraout_XMM0_Dc_00;
              local_148._0_8_ = RVar11;
              local_148._12_4_ = extraout_XMM0_Dd_00;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              uVar19 = local_148._0_4_;
              uVar20 = local_148._4_4_;
            }
            if ((double)local_1c8._0_8_ - dVar3 < -(double)CONCAT44(uVar20,uVar19)) {
              pVVar15 = &local_160;
              if (dVar22 <= 0.0) {
                pVVar15 = &local_178;
                goto joined_r0x002167cd;
              }
              goto LAB_00216620;
            }
          }
LAB_00216635:
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0x10;
        } while (lVar16 < (pIVar7->data).super_SVectorBase<double>.memused);
      }
      local_148._8_8_ = 0;
      local_148._0_8_ =
           (lp->super_LPColSetBase<double>).low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar1];
      dVar22 = (lp->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar1];
      ::soplex::infinity::__tls_init();
      pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_b8 = Tolerances::epsilon(pTVar5);
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      ::soplex::infinity::__tls_init();
      pTVar5 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      RVar11 = Tolerances::epsilon(pTVar5);
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        auVar10._8_4_ = extraout_XMM0_Dc_01;
        auVar10._0_8_ = RVar11;
        auVar10._12_4_ = extraout_XMM0_Dd_01;
        local_1c8._8_8_ = auVar10._8_8_;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      local_1c8._0_8_ = dVar22;
      if (-RVar11 < dVar22 - dVar3) {
        dVar23 = (lp->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar1];
        local_1c8._0_8_ = local_c8;
        if (local_c8 < dVar23) {
          local_1c8._0_8_ = dVar23;
        }
      }
      uVar19 = local_48;
      uVar21 = uStack_44;
      if (dVar22 <= (double)CONCAT44(uStack_44,local_48)) {
        uVar19 = SUB84(dVar22,0);
        uVar21 = (uint)((ulong)dVar22 >> 0x20);
      }
      uVar18 = -(ulong)(dVar3 + (double)local_148._0_8_ < local_b8);
      dVar22 = (double)(~uVar18 & local_148._0_8_ | CONCAT44(uVar21,uVar19) & uVar18);
      if (bVar13) {
        dVar23 = feastol(this);
        if ((dVar23 <= dVar22) || (dVar23 = feastol(this), (double)local_1c8._0_8_ <= -dVar23)) {
          bVar13 = false;
        }
        else {
          local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] = 0.0;
        }
      }
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar1] = dVar22;
      local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar1] = (double)local_1c8._0_8_;
      dVar23 = (double)local_1c8._0_8_;
      if ((local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1] <=
           local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1]) &&
         (dVar23 = dVar22,
         local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar1] <=
         local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar1])) {
        dVar23 = (dVar22 + (double)local_1c8._0_8_) * 0.5;
      }
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar1] = dVar23;
      dVar22 = (lp->super_LPColSetBase<double>).object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar1];
      local_190 = local_190 +
                  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar1] * dVar22;
      local_198 = local_198 +
                  local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar1] * dVar22;
      local_1a0 = local_1a0 + dVar22 * dVar23;
      lVar16 = lVar1;
    } while (1 < local_b0);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,&local_f8);
  bVar12 = checkSolution(this,lp,(VectorBase<double> *)&local_60);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar12) && (this->m_cutoffbound <= local_190 && local_190 != this->m_cutoffbound)) {
    this->m_cutoffbound = local_190;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_78,&local_110);
  bVar12 = checkSolution(this,lp,(VectorBase<double> *)&local_78);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar12) && (this->m_cutoffbound <= local_198 && local_198 != this->m_cutoffbound)) {
    this->m_cutoffbound = local_198;
  }
  if (bVar13) {
    std::vector<double,_std::allocator<double>_>::vector(&local_90,&local_e0);
    bVar13 = checkSolution(this,lp,(VectorBase<double> *)&local_90);
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((bVar13) && (this->m_cutoffbound <= dVar2 && dVar2 != this->m_cutoffbound)) {
      this->m_cutoffbound = dVar2;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,&local_128);
  bVar13 = checkSolution(this,lp,(VectorBase<double> *)&local_a8);
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar13) && (this->m_cutoffbound <= local_1a0 && local_1a0 != this->m_cutoffbound)) {
    this->m_cutoffbound = local_1a0;
  }
  if (local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}